

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_protection(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  CHAR_DATA *in_RDX;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  sn_00 = skill_lookup((char *)in_stack_ffffffffffffff78);
  bVar1 = is_affected(in_RDX,sn_00);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    init_affect((AFFECT_DATA *)0x619b48);
    get_spell_aftype(in_stack_ffffffffffffff68);
    std::pow<int,int>(0,0x619ba2);
    affect_to_char(in_RDX,(AFFECT_DATA *)in_stack_ffffffffffffff68);
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void spell_protection(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, skill_lookup("protection")))
	{
		send_to_char("You are already protected.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 2;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_PROTECTION);

	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You feel protected.\n\r", ch);
}